

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O2

string * get_abi_cxx11_(string *__return_storage_ptr__,node *table,char *key)

{
  int iVar1;
  uint uVar2;
  allocator *paVar3;
  char *pcVar4;
  allocator local_1a;
  allocator local_19;
  
  iVar1 = lookup(table,key);
  if (iVar1 == 0) {
    pcVar4 = "CANNOT GET VALUE";
    paVar3 = &local_1a;
  }
  else {
    std::operator<<((ostream *)&std::cout,"EE bla");
    uVar2 = hash(key,0x1e);
    pcVar4 = table[uVar2].data;
    paVar3 = &local_19;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,paVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string get(node *table,const char* key){
    if(lookup(table, key)){
        std::cout <<"EE bla";
        unsigned index = hash(key, TABLESIZE);
        //const node *it = table[index];

        //std::cout << "\nin get func > " << it->data <<'\n';

        // Попытка установить наличие соответствующего ключа в связанном списке
/*
        while(it != NULL && strcmp(it->key, key) != 0)
        {
            it = it->next;
        }*/
        //std::cout << "\nin get func > " << it->data <<'\n';
        return table[index].data;

    }
    return "CANNOT GET VALUE";
}